

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm.hpp
# Opt level: O2

void __thiscall baryonyx::pnm_array::operator()(pnm_array *this,string *filename)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar1;
  string_view format_str;
  format_args args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> header;
  ulong local_238 [2];
  ulong local_228;
  undefined8 local_218;
  ofstream ofs;
  
  std::ofstream::ofstream(&ofs,(string *)filename,_S_bin);
  local_238[0] = (ulong)this->m_width;
  local_228 = (ulong)this->m_heigth;
  local_218 = 0xff;
  bVar1 = ::fmt::v7::to_string_view<char,_0>("P6 {} {} {} ");
  format_str.data_ = (char *)bVar1.size_;
  format_str.size_ = 0x122;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_238;
  ::fmt::v7::detail::vformat_abi_cxx11_(&header,(detail *)bVar1.data_,format_str,args);
  std::operator<<((ostream *)&ofs,(string *)&header);
  std::ostream::write((char *)&ofs,
                      (long)(this->m_buffer)._M_t.
                            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
  std::__cxx11::string::~string((string *)&header);
  std::ofstream::~ofstream(&ofs);
  return;
}

Assistant:

void operator()(std::string filename) const noexcept
    {
        std::ofstream ofs{ filename, std::ios::binary };
        auto header{ fmt::format("P6 {} {} {} ", m_width, m_heigth, 255) };

        ofs << header;
        ofs.write(reinterpret_cast<char*>(m_buffer.get()), size());
    }